

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ReplicatedAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2,
          SourceRange *args_3)

{
  pointer ppEVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  ReplicatedAssignmentPatternExpression *pRVar5;
  
  pRVar5 = (ReplicatedAssignmentPatternExpression *)allocate(this,0x48,8);
  ppEVar1 = args_2->_M_ptr;
  sVar2 = (args_2->_M_extent)._M_extent_value;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.kind =
       ReplicatedAssignmentPattern;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.type.ptr = args;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc = SVar3;
  (pRVar5->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc = SVar4;
  (pRVar5->super_AssignmentPatternExpressionBase).elements_._M_ptr = ppEVar1;
  (pRVar5->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value = sVar2;
  pRVar5->count_ = args_1;
  return pRVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }